

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clparser.cc
# Opt level: O1

bool anon_unknown.dwarf_4fa23::EndsWith(string *input,string *needle)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  bool bVar4;
  long *local_40;
  size_t local_38;
  long local_30 [2];
  
  uVar1 = input->_M_string_length;
  uVar2 = needle->_M_string_length;
  if (uVar2 <= uVar1) {
    std::__cxx11::string::substr((ulong)&local_40,(ulong)input);
    if (local_38 == needle->_M_string_length) {
      if (local_38 == 0) {
        bVar4 = true;
      }
      else {
        iVar3 = bcmp(local_40,(needle->_M_dataplus)._M_p,local_38);
        bVar4 = iVar3 == 0;
      }
      goto LAB_0010e05d;
    }
  }
  bVar4 = false;
LAB_0010e05d:
  if ((uVar2 <= uVar1) && (local_40 != local_30)) {
    operator_delete(local_40,local_30[0] + 1);
  }
  return bVar4;
}

Assistant:

bool EndsWith(const string& input, const string& needle) {
  return (input.size() >= needle.size() &&
          input.substr(input.size() - needle.size()) == needle);
}